

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

void __thiscall
QMarkdownTextEdit::QMarkdownTextEdit(QMarkdownTextEdit *this,QWidget *parent,bool initHighlighter)

{
  int iVar1;
  QObject *pQVar2;
  LineNumArea *this_00;
  MarkdownHighlighter *this_01;
  QTextDocument *parent_00;
  QFont *pQVar3;
  QVBoxLayout *this_02;
  QPlainTextEditSearchWidget *this_03;
  QWidget *pQVar4;
  offset_in_QAbstractSlider_to_subr signal;
  offset_in_QTextDocument_to_subr signal_00;
  ConnectionType type;
  Object local_128 [8];
  code *local_120;
  undefined8 uStack_118;
  code *local_110;
  undefined8 local_108;
  Object local_100 [8];
  code *local_f8;
  undefined8 local_f0;
  QMarkdownTextEdit *local_e8;
  Object local_e0 [8];
  code *local_d8;
  undefined8 local_d0;
  QMarkdownTextEdit *local_c8;
  Object local_c0 [8];
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  undefined8 local_a0;
  Object local_98 [8];
  code *local_90;
  undefined8 uStack_88;
  code *local_80;
  undefined8 local_78;
  Object local_70 [8];
  QVBoxLayout *local_68;
  QVBoxLayout *layout;
  QFontMetrics local_58 [8];
  QFontMetrics metrics;
  QFont local_48 [4];
  int tabStop;
  QFont font;
  HighlightingOptions local_34;
  QFlags<QMarkdownTextEdit::AutoTextOption> local_30 [5];
  byte local_19;
  QWidget *pQStack_18;
  bool initHighlighter_local;
  QWidget *parent_local;
  QMarkdownTextEdit *this_local;
  
  local_19 = initHighlighter;
  pQStack_18 = parent;
  parent_local = (QWidget *)this;
  QPlainTextEdit::QPlainTextEdit(&this->super_QPlainTextEdit,parent);
  *(undefined ***)this = &PTR_metaObject_001a86b0;
  *(undefined ***)&this->field_0x10 = &PTR__QMarkdownTextEdit_001a88b8;
  QTextCursor::QTextCursor(&this->_textCursor);
  this->_highlighter = (MarkdownHighlighter *)0x0;
  QList<QString>::QList(&this->_ignoredClickUrlSchemata);
  QFlags<QMarkdownTextEdit::AutoTextOption>::QFlags(&this->_autoTextOptions);
  this->_mouseButtonDown = false;
  this->_centerCursor = false;
  this->_highlightCurrentLine = false;
  QColor::QColor(&this->_currentLineHighlightColor);
  this->_debounceDelay = 0;
  this->_lineNumberLeftMarginOffset = 0;
  QObject::installEventFilter((QObject *)this);
  pQVar2 = (QObject *)QAbstractScrollArea::viewport();
  QObject::installEventFilter(pQVar2);
  QFlags<QMarkdownTextEdit::AutoTextOption>::QFlags(local_30,BracketClosing);
  (this->_autoTextOptions).i = local_30[0].i;
  this_00 = (LineNumArea *)operator_new(0x58);
  LineNumArea::LineNumArea(this_00,this);
  this->_lineNumArea = this_00;
  updateLineNumberAreaWidth(this,0);
  this->_highlightingEnabled = (bool)(local_19 & 1);
  if ((local_19 & 1) != 0) {
    this_01 = (MarkdownHighlighter *)operator_new(0x58);
    parent_00 = (QTextDocument *)QPlainTextEdit::document();
    QFlags<MarkdownHighlighter::HighlightingOption>::QFlags(&local_34,None);
    MarkdownHighlighter::MarkdownHighlighter(this_01,parent_00,local_34);
    this->_highlighter = this_01;
  }
  pQVar3 = QWidget::font((QWidget *)this);
  QFont::QFont(local_48,pQVar3);
  QFontMetrics::QFontMetrics(local_58,local_48);
  QLatin1Char::QLatin1Char((QLatin1Char *)((long)&layout + 5),' ');
  QChar::QChar((QChar *)((long)&layout + 6),layout._5_1_);
  iVar1 = QFontMetrics::horizontalAdvance((QChar *)local_58);
  QPlainTextEdit::setTabStopDistance((double)(iVar1 << 2));
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02,(QWidget *)this);
  local_68 = this_02;
  QLayout::setContentsMargins((int)this_02,0,0,0);
  QBoxLayout::addStretch((int)local_68);
  QWidget::setLayout((QLayout *)this);
  this_03 = (QPlainTextEditSearchWidget *)operator_new(0x98);
  QPlainTextEditSearchWidget::QPlainTextEditSearchWidget
            ((QPlainTextEditSearchWidget *)this_03,&this->super_QPlainTextEdit);
  this->_searchWidget = this_03;
  pQVar4 = (QWidget *)QWidget::layout();
  QLayout::addWidget(pQVar4);
  local_80 = QPlainTextEdit::textChanged;
  local_78 = 0;
  local_90 = adjustRightMargin;
  uStack_88 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QPlainTextEdit::*)(),void(QMarkdownTextEdit::*)()>
            (local_70,(offset_in_QPlainTextEdit_to_subr)this,(Object *)QPlainTextEdit::textChanged,0
             ,type);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  local_a8 = QPlainTextEdit::cursorPositionChanged;
  local_a0 = 0;
  local_b8 = centerTheCursor;
  uStack_b0 = 0;
  QObject::connect<void(QPlainTextEdit::*)(),void(QMarkdownTextEdit::*)()>
            (local_98,(offset_in_QPlainTextEdit_to_subr)this,
             (Object *)QPlainTextEdit::cursorPositionChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  signal = QAbstractScrollArea::verticalScrollBar();
  local_d8 = QAbstractSlider::valueChanged;
  local_d0 = 0;
  local_c8 = this;
  QObject::
  connect<void(QAbstractSlider::*)(int),QMarkdownTextEdit::QMarkdownTextEdit(QWidget*,bool)::__0>
            (local_c0,signal,(QObject *)QAbstractSlider::valueChanged,
             (anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  local_f8 = QPlainTextEdit::cursorPositionChanged;
  local_f0 = 0;
  local_e8 = this;
  QObject::
  connect<void(QPlainTextEdit::*)(),QMarkdownTextEdit::QMarkdownTextEdit(QWidget*,bool)::__1>
            (local_e0,(offset_in_QPlainTextEdit_to_subr)this,
             (QObject *)QPlainTextEdit::cursorPositionChanged,
             (anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  signal_00 = QPlainTextEdit::document();
  local_110 = QTextDocument::blockCountChanged;
  local_108 = 0;
  local_120 = updateLineNumberAreaWidth;
  uStack_118 = 0;
  QObject::connect<void(QTextDocument::*)(int),void(QMarkdownTextEdit::*)(int)>
            (local_100,signal_00,(Object *)QTextDocument::blockCountChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_100);
  QObject::connect<void(QPlainTextEdit::*)(QRect_const&,int),void(QMarkdownTextEdit::*)(QRect,int)>
            (local_128,(offset_in_QPlainTextEdit_to_subr)this,
             (Object *)QPlainTextEdit::updateRequest,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_128);
  updateSettings(this);
  QTimer::singleShot<int,void(QMarkdownTextEdit::*)()>(300,this,0x1115b0);
  QFontMetrics::~QFontMetrics(local_58);
  QFont::~QFont(local_48);
  return;
}

Assistant:

QMarkdownTextEdit::QMarkdownTextEdit(QWidget *parent, bool initHighlighter)
    : QPlainTextEdit(parent) {
    installEventFilter(this);
    viewport()->installEventFilter(this);
    _autoTextOptions = AutoTextOption::BracketClosing;

    _lineNumArea = new LineNumArea(this);
    updateLineNumberAreaWidth(0);

    // markdown highlighting is enabled by default
    _highlightingEnabled = initHighlighter;
    if (initHighlighter) {
        _highlighter = new MarkdownHighlighter(document());
    }

    QFont font = this->font();

    // set the tab stop to the width of 4 spaces in the editor
    constexpr int tabStop = 4;
    QFontMetrics metrics(font);

#if QT_VERSION < QT_VERSION_CHECK(5, 11, 0)
    setTabStopWidth(tabStop * metrics.width(' '));
#else
    setTabStopDistance(tabStop * metrics.horizontalAdvance(QLatin1Char(' ')));
#endif

    // add shortcuts for duplicating text
    //    new QShortcut( QKeySequence( "Ctrl+D" ), this, SLOT( duplicateText() )
    //    ); new QShortcut( QKeySequence( "Ctrl+Alt+Down" ), this, SLOT(
    //    duplicateText() ) );

    // add a layout to the widget
    auto *layout = new QVBoxLayout(this);
    layout->setContentsMargins(0, 0, 0, 0);
    layout->addStretch();
    this->setLayout(layout);

    // add the hidden search widget
    _searchWidget = new QPlainTextEditSearchWidget(this);
    this->layout()->addWidget(_searchWidget);

    connect(this, &QPlainTextEdit::textChanged, this,
            &QMarkdownTextEdit::adjustRightMargin);
    connect(this, &QPlainTextEdit::cursorPositionChanged, this,
            &QMarkdownTextEdit::centerTheCursor);
    connect(verticalScrollBar(), &QScrollBar::valueChanged, this, [this](int) {
        _lineNumArea->update();
    });
    connect(this, &QPlainTextEdit::cursorPositionChanged, this, [this]() {
        _lineNumArea->update();

        auto oldArea = blockBoundingGeometry(_textCursor.block()).translated(contentOffset());
        _textCursor = textCursor();
        auto newArea = blockBoundingGeometry(_textCursor.block()).translated(contentOffset());
        auto areaToUpdate = oldArea | newArea;
        viewport()->update(areaToUpdate.toRect());
    });
    connect(document(), &QTextDocument::blockCountChanged,
            this, &QMarkdownTextEdit::updateLineNumberAreaWidth);
    connect(this, &QPlainTextEdit::updateRequest,
            this, &QMarkdownTextEdit::updateLineNumberArea);

    updateSettings();

    // workaround for disabled signals up initialization
    QTimer::singleShot(300, this, &QMarkdownTextEdit::adjustRightMargin);
}